

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_from_integer(uintmax_t n)

{
  ulong uVar1;
  mp_int *pmVar2;
  size_t i;
  ulong uVar3;
  
  pmVar2 = mp_make_sized(1);
  uVar1 = pmVar2->nw;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    pmVar2->w[uVar3] = n;
  }
  return pmVar2;
}

Assistant:

mp_int *mp_from_integer(uintmax_t n)
{
    mp_int *x = mp_make_sized(
        (sizeof(n) + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES);
    for (size_t i = 0; i < x->nw; i++)
        x->w[i] = n >> (i * BIGNUM_INT_BITS);
    return x;
}